

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFullTypeName(ParserImpl *this,string *name)

{
  bool bVar1;
  string part;
  allocator local_51;
  string local_50;
  
  bVar1 = ConsumeIdentifier(this,name);
  if (bVar1) {
    while( true ) {
      std::__cxx11::string::string((string *)&local_50,".",&local_51);
      bVar1 = TryConsume(this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (!bVar1) break;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      bVar1 = ConsumeIdentifier(this,&local_50);
      if (!bVar1) {
        std::__cxx11::string::~string((string *)&local_50);
        goto LAB_0032f744;
      }
      std::__cxx11::string::append((char *)name);
      std::__cxx11::string::append((string *)name);
      std::__cxx11::string::~string((string *)&local_50);
    }
    bVar1 = true;
  }
  else {
LAB_0032f744:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ConsumeFullTypeName(string* name) {
    DO(ConsumeIdentifier(name));
    while (TryConsume(".")) {
      string part;
      DO(ConsumeIdentifier(&part));
      *name += ".";
      *name += part;
    }
    return true;
  }